

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O2

void __thiscall egc::Sequencer::QXCH(Sequencer *this,unsigned_short instruction)

{
  unsigned_short word;
  unsigned_short word_00;
  ostream *poVar1;
  ushort address;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"QXCH");
  poVar1 = std::operator<<(poVar1," ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  address = instruction & 0x3ff;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,address);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar1);
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,address,0);
  word_00 = Memory::Read((this->m_Memory).
                         super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,2,0);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address,word_00);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                2,word);
  return;
}

Assistant:

void egc::Sequencer::QXCH (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "QXCH" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto q = m_Memory->Read(000002u);

    m_Memory->Write(k, q);
    m_Memory->Write(00002u, mk);
}